

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

Trivia __thiscall
slang::parsing::Preprocessor::handleResetAllDirective(Preprocessor *this,Token directive)

{
  Trivia TVar1;
  
  checkOutsideDesignElement(this,directive);
  resetAllDirectives(this);
  TVar1 = createSimpleDirective(this,directive);
  TVar1._8_8_ = TVar1._8_8_ & 0xffffffffffff;
  return TVar1;
}

Assistant:

Trivia Preprocessor::handleResetAllDirective(Token directive) {
    checkOutsideDesignElement(directive);
    resetAllDirectives();
    return createSimpleDirective(directive);
}